

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  byte bVar15;
  byte bVar16;
  int *piVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  pointer piVar20;
  uint uVar21;
  _func_int **pp_Var22;
  int iVar23;
  ulong uVar24;
  _func_int ***ppp_Var25;
  _func_int *p_Var26;
  ulong uVar27;
  int iVar28;
  float *pfVar29;
  _func_int ***ppp_Var30;
  undefined1 (*pauVar31) [32];
  int iVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  uint uVar37;
  int iVar38;
  void *pvVar39;
  long lVar40;
  uint uVar41;
  ushort uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  allocator_type local_221;
  undefined8 local_220;
  Mat local_218;
  ulong local_1d0;
  Mat *local_1c8;
  ulong local_1c0;
  Mat local_1b8;
  int local_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined1 local_148 [16];
  long local_130;
  Allocator *local_128;
  long local_120;
  void *local_118;
  long local_110;
  _func_int ***local_108;
  long local_100;
  undefined1 local_f8 [32];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [64];
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  
  local_168 = bottom_top_blob->w;
  local_220 = (ulong)(uint)bottom_top_blob->h;
  uVar37 = bottom_top_blob->c;
  uVar27 = (ulong)uVar37;
  _elemsize = bottom_top_blob->elemsize;
  local_1b8.cstep = 0;
  local_1b8.data = (Allocator *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1b8.elempack = 0;
  iStack_164 = 0;
  local_1b8.allocator = (Allocator *)local_1b8.data;
  local_1b8.dims = (int)local_1b8.refcount;
  local_1b8.w = local_1b8.refcount._4_4_;
  local_1b8._48_8_ = local_1b8.elemsize;
  local_1b8.c = local_1b8.elempack;
  Mat::create(&local_1b8,local_168,bottom_top_blob->h,uVar37,_elemsize,opt->workspace_allocator);
  iVar33 = -100;
  if (((Allocator *)local_1b8.data == (Allocator *)0x0) ||
     ((long)local_1b8.c * local_1b8.cstep == 0)) goto LAB_0032a97b;
  uVar41 = (int)local_220 * local_168;
  if (0 < (int)uVar37) {
    uVar24 = 0;
    do {
      pfVar29 = (float *)(bottom_top_blob->cstep * uVar24 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var25 = (_func_int ***)
                  ((long)(_func_int ***)local_1b8.data +
                  local_1b8.cstep * uVar24 * local_1b8.elemsize);
      if ((int)uVar41 < 8) {
        uVar21 = 0;
      }
      else {
        iVar33 = 7;
        do {
          auVar64._4_4_ = pfVar29[1] * pfVar29[1];
          auVar64._0_4_ = *pfVar29 * *pfVar29;
          auVar64._8_4_ = pfVar29[2] * pfVar29[2];
          auVar64._12_4_ = pfVar29[3] * pfVar29[3];
          auVar64._16_4_ = pfVar29[4] * pfVar29[4];
          auVar64._20_4_ = pfVar29[5] * pfVar29[5];
          auVar64._24_4_ = pfVar29[6] * pfVar29[6];
          auVar64._28_4_ = pfVar29[7];
          *(undefined1 (*) [32])ppp_Var25 = auVar64;
          pfVar29 = pfVar29 + 8;
          ppp_Var25 = ppp_Var25 + 4;
          iVar33 = iVar33 + 8;
          uVar21 = uVar41 & 0xfffffff8;
        } while (iVar33 < (int)uVar41);
      }
      if (uVar41 - uVar21 != 0 && (int)uVar21 <= (int)uVar41) {
        lVar36 = 0;
        do {
          *(float *)((long)ppp_Var25 + lVar36 * 4) = pfVar29[lVar36] * pfVar29[lVar36];
          lVar36 = lVar36 + 1;
        } while (uVar41 - uVar21 != (int)lVar36);
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar27);
  }
  pp_Var22 = this->_vptr_LRN_x86_avx512;
  iVar33 = 0;
  local_1c0 = uVar27;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var22[-3]) == 0) {
    local_218.cstep = 0;
    local_218.data = (Allocator *)0x0;
    local_218.refcount._0_4_ = 0;
    local_218.refcount._4_4_ = 0;
    local_218.elemsize._0_4_ = 0;
    local_218.elemsize._4_4_ = 0;
    local_218.elempack = 0;
    local_218.allocator = (Allocator *)0x0;
    local_218.dims = 0;
    local_218.w = 0;
    local_218.h = 0;
    local_218.d = 0;
    local_218.c = 0;
    Mat::create(&local_218,local_168,(int)local_220,uVar37,_elemsize,opt->workspace_allocator);
    if (((Allocator *)local_218.data == (Allocator *)0x0) ||
       (local_218.cstep * (long)local_218.c == 0)) {
      piVar17 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
      if (piVar17 != (int *)0x0) {
        LOCK();
        *piVar17 = *piVar17 + -1;
        UNLOCK();
        if (*piVar17 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
joined_r0x0032a953:
            if ((Allocator *)local_218.data != (Allocator *)0x0) {
              free(local_218.data);
            }
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
LAB_0032a976:
      iVar33 = -100;
      goto LAB_0032a97b;
    }
    uVar21 = (int)local_218.cstep * local_218.c;
    if (0 < (int)uVar21) {
      memset(local_218.data,0,(ulong)uVar21 << 2);
    }
    if (0 < (int)uVar37) {
      pp_Var22 = this->_vptr_LRN_x86_avx512;
      local_148 = ZEXT416((uint)(*(float *)(&this->field_0xd8 + (long)pp_Var22[-3]) /
                                (float)*(int *)(&this->field_0xd4 + (long)pp_Var22[-3])));
      auVar65 = ZEXT1664(local_148);
      local_f8 = vbroadcastss_avx512vl(local_148);
      uVar24 = 0;
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      local_220 = CONCAT44(local_220._4_4_,uVar41) & 0xfffffffffffffff8;
      uVar37 = uVar41 & 0xfffffff8;
      local_1c8 = bottom_top_blob;
      do {
        auVar79._8_4_ = 0x3f3504f3;
        auVar79._0_8_ = 0x3f3504f33f3504f3;
        auVar78._8_4_ = 0xffffff82;
        auVar78._0_8_ = 0xffffff82ffffff82;
        auVar61._8_4_ = 0x807fffff;
        auVar61._0_8_ = 0x807fffff807fffff;
        auVar58._8_4_ = 0x3f000000;
        auVar58._0_8_ = 0x3f0000003f000000;
        auVar76._8_4_ = 0x800000;
        auVar76._0_8_ = 0x80000000800000;
        auVar73._8_4_ = 0xbe7ffffc;
        auVar73._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar79._12_4_ = 0x3f3504f3;
        auVar78._12_4_ = 0xffffff82;
        auVar61._12_4_ = 0x807fffff;
        auVar58._12_4_ = 0x3f000000;
        auVar76._12_4_ = 0x800000;
        auVar73._12_4_ = 0xbe7ffffc;
        auVar79._16_4_ = 0x3f3504f3;
        auVar78._16_4_ = 0xffffff82;
        auVar61._16_4_ = 0x807fffff;
        auVar58._16_4_ = 0x3f000000;
        auVar76._16_4_ = 0x800000;
        auVar73._16_4_ = 0xbe7ffffc;
        auVar79._20_4_ = 0x3f3504f3;
        auVar78._20_4_ = 0xffffff82;
        auVar61._20_4_ = 0x807fffff;
        auVar58._20_4_ = 0x3f000000;
        auVar76._20_4_ = 0x800000;
        auVar73._20_4_ = 0xbe7ffffc;
        auVar79._24_4_ = 0x3f3504f3;
        auVar78._24_4_ = 0xffffff82;
        auVar61._24_4_ = 0x807fffff;
        auVar58._24_4_ = 0x3f000000;
        auVar76._24_4_ = 0x800000;
        auVar73._24_4_ = 0xbe7ffffc;
        auVar79._28_4_ = 0x3f3504f3;
        auVar78._28_4_ = 0xffffff82;
        auVar61._28_4_ = 0x807fffff;
        auVar58._28_4_ = 0x3f000000;
        auVar76._28_4_ = 0x800000;
        auVar73._28_4_ = 0xbe7ffffc;
        p_Var26 = pp_Var22[-3];
        iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var26) / 2;
        iVar38 = (int)uVar24;
        uVar21 = iVar38 - iVar33;
        if ((int)uVar21 <= iVar33 + iVar38) {
          do {
            if (uVar21 < (uint)uVar27) {
              ppp_Var25 = (_func_int ***)
                          ((long)(_func_int ***)local_1b8.data +
                          uVar21 * local_1b8.cstep * local_1b8.elemsize);
              ppp_Var30 = (_func_int ***)
                          ((long)(_func_int ***)local_218.data +
                          local_218.cstep * uVar24 *
                          CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize));
              uVar34 = 0;
              if (7 < (int)uVar41) {
                iVar33 = 7;
                do {
                  auVar51._0_4_ = *(float *)ppp_Var30 + *(float *)ppp_Var25;
                  auVar51._4_4_ = *(float *)((long)ppp_Var30 + 4) + *(float *)((long)ppp_Var25 + 4);
                  auVar51._8_4_ = *(float *)(ppp_Var30 + 1) + *(float *)(ppp_Var25 + 1);
                  auVar51._12_4_ =
                       *(float *)((long)(ppp_Var30 + 1) + 4) + *(float *)((long)(ppp_Var25 + 1) + 4)
                  ;
                  auVar51._16_4_ = *(float *)(ppp_Var30 + 2) + *(float *)(ppp_Var25 + 2);
                  auVar51._20_4_ =
                       *(float *)((long)(ppp_Var30 + 2) + 4) + *(float *)((long)(ppp_Var25 + 2) + 4)
                  ;
                  auVar51._24_4_ = *(float *)(ppp_Var30 + 3) + *(float *)(ppp_Var25 + 3);
                  auVar51._28_4_ =
                       *(float *)((long)(ppp_Var30 + 3) + 4) + *(float *)((long)(ppp_Var25 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var30 = auVar51;
                  ppp_Var25 = ppp_Var25 + 4;
                  ppp_Var30 = ppp_Var30 + 4;
                  iVar33 = iVar33 + 8;
                  uVar34 = uVar37;
                } while (iVar33 < (int)uVar41);
              }
              if (uVar41 - uVar34 != 0 && (int)uVar34 <= (int)uVar41) {
                lVar36 = 0;
                do {
                  *(float *)((long)ppp_Var30 + lVar36 * 4) =
                       *(float *)((long)ppp_Var30 + lVar36 * 4) +
                       *(float *)((long)ppp_Var25 + lVar36 * 4);
                  lVar36 = lVar36 + 1;
                } while (uVar41 - uVar34 != (int)lVar36);
              }
            }
            p_Var26 = pp_Var22[-3];
            bVar8 = (int)uVar21 < *(int *)(&this->field_0xd4 + (long)p_Var26) / 2 + iVar38;
            uVar21 = uVar21 + 1;
          } while (bVar8);
        }
        pauVar31 = (undefined1 (*) [32])
                   (local_1c8->cstep * uVar24 * local_1c8->elemsize + (long)local_1c8->data);
        ppp_Var25 = (_func_int ***)
                    ((long)(_func_int ***)local_218.data +
                    local_218.cstep * uVar24 *
                    CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize));
        local_b8._0_8_ = uVar24;
        uVar21 = 0;
        if (7 < (int)uVar41) {
          local_168 = *(int *)(&this->field_0xe0 + (long)p_Var26);
          local_d8 = -*(float *)(&this->field_0xdc + (long)p_Var26);
          iVar33 = 7;
          auVar51 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar80._8_4_ = 0xc2b0c0a5;
          auVar80._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar80._12_4_ = 0xc2b0c0a5;
          auVar80._16_4_ = 0xc2b0c0a5;
          auVar80._20_4_ = 0xc2b0c0a5;
          auVar80._24_4_ = 0xc2b0c0a5;
          auVar80._28_4_ = 0xc2b0c0a5;
          auVar81._8_4_ = 0x3fb8aa3b;
          auVar81._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar81._12_4_ = 0x3fb8aa3b;
          auVar81._16_4_ = 0x3fb8aa3b;
          auVar81._20_4_ = 0x3fb8aa3b;
          auVar81._24_4_ = 0x3fb8aa3b;
          auVar81._28_4_ = 0x3fb8aa3b;
          auVar82._8_4_ = 0x39506967;
          auVar82._0_8_ = 0x3950696739506967;
          auVar82._12_4_ = 0x39506967;
          auVar82._16_4_ = 0x39506967;
          auVar82._20_4_ = 0x39506967;
          auVar82._24_4_ = 0x39506967;
          auVar82._28_4_ = 0x39506967;
          auVar83._8_4_ = 0x3ab743ce;
          auVar83._0_8_ = 0x3ab743ce3ab743ce;
          auVar83._12_4_ = 0x3ab743ce;
          auVar83._16_4_ = 0x3ab743ce;
          auVar83._20_4_ = 0x3ab743ce;
          auVar83._24_4_ = 0x3ab743ce;
          auVar83._28_4_ = 0x3ab743ce;
          auVar84._8_4_ = 0x3c088908;
          auVar84._0_8_ = 0x3c0889083c088908;
          auVar84._12_4_ = 0x3c088908;
          auVar84._16_4_ = 0x3c088908;
          auVar84._20_4_ = 0x3c088908;
          auVar84._24_4_ = 0x3c088908;
          auVar84._28_4_ = 0x3c088908;
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar54 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          do {
            auVar18._4_4_ = local_168;
            auVar18._0_4_ = local_168;
            auVar18._8_4_ = local_168;
            auVar18._12_4_ = local_168;
            auVar18._16_4_ = local_168;
            auVar18._20_4_ = local_168;
            auVar18._24_4_ = local_168;
            auVar18._28_4_ = local_168;
            auVar55 = vfmadd213ps_avx512vl(*(undefined1 (*) [32])ppp_Var25,local_f8,auVar18);
            auVar59 = vmaxps_avx(auVar55,auVar76);
            auVar77 = vpsrld_avx2(auVar59,0x17);
            auVar56 = vpternlogd_avx512vl(auVar59,auVar58,auVar61,0xec);
            uVar27 = vcmpps_avx512vl(auVar56,auVar79,1);
            auVar57 = vmovdqa64_avx512vl(auVar58);
            auVar59._8_4_ = 0xbf800000;
            auVar59._0_8_ = 0xbf800000bf800000;
            auVar59._12_4_ = 0xbf800000;
            auVar59._16_4_ = 0xbf800000;
            auVar59._20_4_ = 0xbf800000;
            auVar59._24_4_ = 0xbf800000;
            auVar59._28_4_ = 0xbf800000;
            auVar58 = vaddps_avx512vl(auVar56,auVar59);
            auVar59 = vaddps_avx512vl(auVar58,auVar56);
            bVar8 = (bool)((byte)uVar27 & 1);
            auVar60._0_4_ = (float)((uint)bVar8 * auVar59._0_4_ | (uint)!bVar8 * auVar58._0_4_);
            bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar60._4_4_ = (float)((uint)bVar8 * auVar59._4_4_ | (uint)!bVar8 * auVar58._4_4_);
            bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar60._8_4_ = (float)((uint)bVar8 * auVar59._8_4_ | (uint)!bVar8 * auVar58._8_4_);
            bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar60._12_4_ = (float)((uint)bVar8 * auVar59._12_4_ | (uint)!bVar8 * auVar58._12_4_);
            bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
            auVar60._16_4_ = (float)((uint)bVar8 * auVar59._16_4_ | (uint)!bVar8 * auVar58._16_4_);
            bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
            auVar60._20_4_ = (float)((uint)bVar8 * auVar59._20_4_ | (uint)!bVar8 * auVar58._20_4_);
            bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
            auVar60._24_4_ = (float)((uint)bVar8 * auVar59._24_4_ | (uint)!bVar8 * auVar58._24_4_);
            bVar8 = SUB81(uVar27 >> 7,0);
            auVar60._28_4_ = (uint)bVar8 * auVar59._28_4_ | (uint)!bVar8 * auVar58._28_4_;
            auVar75._8_4_ = 0x3d9021bb;
            auVar75._0_8_ = 0x3d9021bb3d9021bb;
            auVar75._12_4_ = 0x3d9021bb;
            auVar75._16_4_ = 0x3d9021bb;
            auVar75._20_4_ = 0x3d9021bb;
            auVar75._24_4_ = 0x3d9021bb;
            auVar75._28_4_ = 0x3d9021bb;
            auVar56._8_4_ = 0xbdebd1b8;
            auVar56._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar56._12_4_ = 0xbdebd1b8;
            auVar56._16_4_ = 0xbdebd1b8;
            auVar56._20_4_ = 0xbdebd1b8;
            auVar56._24_4_ = 0xbdebd1b8;
            auVar56._28_4_ = 0xbdebd1b8;
            auVar58 = vfmadd213ps_avx512vl(auVar75,auVar60,auVar56);
            auVar12._8_4_ = 0x3def251a;
            auVar12._0_8_ = 0x3def251a3def251a;
            auVar12._12_4_ = 0x3def251a;
            auVar12._16_4_ = 0x3def251a;
            auVar12._20_4_ = 0x3def251a;
            auVar12._24_4_ = 0x3def251a;
            auVar12._28_4_ = 0x3def251a;
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar12);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar45);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar46);
            auVar59 = vmovdqa64_avx512vl(auVar61);
            auVar19._4_4_ = auVar60._4_4_ * auVar60._4_4_;
            auVar19._0_4_ = auVar60._0_4_ * auVar60._0_4_;
            auVar19._8_4_ = auVar60._8_4_ * auVar60._8_4_;
            auVar19._12_4_ = auVar60._12_4_ * auVar60._12_4_;
            auVar19._16_4_ = auVar60._16_4_ * auVar60._16_4_;
            auVar19._20_4_ = auVar60._20_4_ * auVar60._20_4_;
            auVar19._24_4_ = auVar60._24_4_ * auVar60._24_4_;
            auVar19._28_4_ = auVar61._28_4_;
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar47);
            auVar58 = vfmadd213ps_avx512vl(auVar58,auVar60,auVar48);
            auVar9 = vfmadd213ps_fma(auVar58,auVar60,auVar73);
            auVar13._8_4_ = 0x3eaaaaaa;
            auVar13._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar13._12_4_ = 0x3eaaaaaa;
            auVar13._16_4_ = 0x3eaaaaaa;
            auVar13._20_4_ = 0x3eaaaaaa;
            auVar13._24_4_ = 0x3eaaaaaa;
            auVar13._28_4_ = 0x3eaaaaaa;
            auVar58 = vfmadd213ps_avx512vl(ZEXT1632(auVar9),auVar60,auVar13);
            auVar14._4_4_ = auVar60._4_4_ * auVar60._4_4_ * auVar60._4_4_ * auVar58._4_4_;
            auVar14._0_4_ = auVar60._0_4_ * auVar60._0_4_ * auVar60._0_4_ * auVar58._0_4_;
            auVar14._8_4_ = auVar60._8_4_ * auVar60._8_4_ * auVar60._8_4_ * auVar58._8_4_;
            auVar14._12_4_ = auVar60._12_4_ * auVar60._12_4_ * auVar60._12_4_ * auVar58._12_4_;
            auVar14._16_4_ = auVar60._16_4_ * auVar60._16_4_ * auVar60._16_4_ * auVar58._16_4_;
            auVar14._20_4_ = auVar60._20_4_ * auVar60._20_4_ * auVar60._20_4_ * auVar58._20_4_;
            auVar14._24_4_ = auVar60._24_4_ * auVar60._24_4_ * auVar60._24_4_ * auVar58._24_4_;
            auVar14._28_4_ = auVar58._28_4_;
            auVar58 = vpaddd_avx2(auVar77,auVar78);
            auVar58 = vcvtdq2ps_avx(auVar58);
            auVar61 = vsubps_avx512vl(auVar58,auVar44);
            bVar8 = (bool)((byte)uVar27 & 1);
            auVar62._0_4_ = (uint)bVar8 * auVar61._0_4_ | (uint)!bVar8 * auVar58._0_4_;
            bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar62._4_4_ = (uint)bVar8 * auVar61._4_4_ | (uint)!bVar8 * auVar58._4_4_;
            bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar62._8_4_ = (uint)bVar8 * auVar61._8_4_ | (uint)!bVar8 * auVar58._8_4_;
            bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar62._12_4_ = (uint)bVar8 * auVar61._12_4_ | (uint)!bVar8 * auVar58._12_4_;
            bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
            auVar62._16_4_ = (uint)bVar8 * auVar61._16_4_ | (uint)!bVar8 * auVar58._16_4_;
            bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
            auVar62._20_4_ = (uint)bVar8 * auVar61._20_4_ | (uint)!bVar8 * auVar58._20_4_;
            bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
            auVar62._24_4_ = (uint)bVar8 * auVar61._24_4_ | (uint)!bVar8 * auVar58._24_4_;
            bVar8 = SUB81(uVar27 >> 7,0);
            auVar62._28_4_ = (uint)bVar8 * auVar61._28_4_ | (uint)!bVar8 * auVar58._28_4_;
            auVar58 = vfmadd231ps_avx512vl(auVar14,auVar62,auVar64);
            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar49,auVar19);
            auVar61 = vmovdqa64_avx512vl(auVar59);
            uVar27 = vcmpps_avx512vl(auVar55,_DAT_005192a0,2);
            auVar58 = vsubps_avx(auVar58,auVar60);
            auVar59 = vfmsub231ps_avx512vl(auVar58,auVar50,auVar62);
            auVar58 = vpcmpeqd_avx2(auVar48,auVar48);
            bVar8 = (bool)((byte)uVar27 & 1);
            bVar1 = (bool)((byte)(uVar27 >> 1) & 1);
            bVar2 = (bool)((byte)(uVar27 >> 2) & 1);
            bVar3 = (bool)((byte)(uVar27 >> 3) & 1);
            bVar4 = (bool)((byte)(uVar27 >> 4) & 1);
            bVar5 = (bool)((byte)(uVar27 >> 5) & 1);
            bVar6 = (bool)((byte)(uVar27 >> 6) & 1);
            bVar7 = SUB81(uVar27 >> 7,0);
            auVar55._4_4_ =
                 (float)((uint)bVar1 * auVar58._4_4_ | (uint)!bVar1 * auVar59._4_4_) * local_d8;
            auVar55._0_4_ =
                 (float)((uint)bVar8 * auVar58._0_4_ | (uint)!bVar8 * auVar59._0_4_) * local_d8;
            auVar55._8_4_ =
                 (float)((uint)bVar2 * auVar58._8_4_ | (uint)!bVar2 * auVar59._8_4_) * local_d8;
            auVar55._12_4_ =
                 (float)((uint)bVar3 * auVar58._12_4_ | (uint)!bVar3 * auVar59._12_4_) * local_d8;
            auVar55._16_4_ =
                 (float)((uint)bVar4 * auVar58._16_4_ | (uint)!bVar4 * auVar59._16_4_) * local_d8;
            auVar55._20_4_ =
                 (float)((uint)bVar5 * auVar58._20_4_ | (uint)!bVar5 * auVar59._20_4_) * local_d8;
            auVar55._24_4_ =
                 (float)((uint)bVar6 * auVar58._24_4_ | (uint)!bVar6 * auVar59._24_4_) * local_d8;
            auVar55._28_4_ = (uint)bVar7 * auVar58._28_4_ | (uint)!bVar7 * auVar59._28_4_;
            auVar58 = vminps_avx512vl(auVar55,auVar51);
            auVar58 = vmaxps_avx(auVar80,auVar58);
            auVar9 = vfmadd231ps_fma(auVar49,auVar58,auVar81);
            auVar59 = vroundps_avx(ZEXT1632(auVar9),1);
            uVar27 = vcmpps_avx512vl(ZEXT1632(auVar9),auVar59,1);
            auVar56 = vsubps_avx512vl(auVar59,auVar44);
            bVar8 = (bool)((byte)uVar27 & 1);
            auVar63._0_4_ = (float)((uint)bVar8 * auVar56._0_4_ | (uint)!bVar8 * auVar59._0_4_);
            bVar8 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar63._4_4_ = (float)((uint)bVar8 * auVar56._4_4_ | (uint)!bVar8 * auVar59._4_4_);
            bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar63._8_4_ = (float)((uint)bVar8 * auVar56._8_4_ | (uint)!bVar8 * auVar59._8_4_);
            bVar8 = (bool)((byte)(uVar27 >> 3) & 1);
            auVar63._12_4_ = (float)((uint)bVar8 * auVar56._12_4_ | (uint)!bVar8 * auVar59._12_4_);
            bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
            auVar63._16_4_ = (float)((uint)bVar8 * auVar56._16_4_ | (uint)!bVar8 * auVar59._16_4_);
            bVar8 = (bool)((byte)(uVar27 >> 5) & 1);
            auVar63._20_4_ = (float)((uint)bVar8 * auVar56._20_4_ | (uint)!bVar8 * auVar59._20_4_);
            bVar8 = (bool)((byte)(uVar27 >> 6) & 1);
            auVar63._24_4_ = (float)((uint)bVar8 * auVar56._24_4_ | (uint)!bVar8 * auVar59._24_4_);
            bVar8 = SUB81(uVar27 >> 7,0);
            auVar63._28_4_ = (float)((uint)bVar8 * auVar56._28_4_ | (uint)!bVar8 * auVar59._28_4_);
            auVar58 = vfmsub231ps_avx512vl(auVar58,auVar63,auVar50);
            auVar58 = vfnmsub231ps_avx512vl(auVar58,auVar63,auVar64);
            auVar9 = vfmadd213ps_fma(auVar82,auVar58,auVar83);
            auVar77._4_4_ = auVar58._4_4_ * auVar58._4_4_;
            auVar77._0_4_ = auVar58._0_4_ * auVar58._0_4_;
            auVar77._8_4_ = auVar58._8_4_ * auVar58._8_4_;
            auVar77._12_4_ = auVar58._12_4_ * auVar58._12_4_;
            auVar77._16_4_ = auVar58._16_4_ * auVar58._16_4_;
            auVar77._20_4_ = auVar58._20_4_ * auVar58._20_4_;
            auVar77._24_4_ = auVar58._24_4_ * auVar58._24_4_;
            auVar77._28_4_ = auVar60._28_4_;
            auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar58,auVar84);
            auVar59 = vfmadd213ps_avx512vl(ZEXT1632(auVar9),auVar58,auVar52);
            auVar59 = vfmadd213ps_avx512vl(auVar59,auVar58,auVar53);
            auVar59 = vfmadd213ps_avx512vl(auVar59,auVar58,auVar49);
            auVar9 = vfmadd213ps_fma(auVar59,auVar77,auVar58);
            auVar58 = vmovdqa64_avx512vl(auVar57);
            auVar74._0_4_ = (int)auVar63._0_4_;
            auVar74._4_4_ = (int)auVar63._4_4_;
            auVar74._8_4_ = (int)auVar63._8_4_;
            auVar74._12_4_ = (int)auVar63._12_4_;
            auVar74._16_4_ = (int)auVar63._16_4_;
            auVar74._20_4_ = (int)auVar63._20_4_;
            auVar74._24_4_ = (int)auVar63._24_4_;
            auVar74._28_4_ = (int)auVar63._28_4_;
            auVar59 = vpslld_avx2(auVar74,0x17);
            auVar59 = vpaddd_avx512vl(auVar59,auVar54);
            auVar57._4_4_ = auVar59._4_4_ * *(float *)((long)*pauVar31 + 4);
            auVar57._0_4_ = auVar59._0_4_ * *(float *)*pauVar31;
            auVar57._8_4_ = auVar59._8_4_ * *(float *)((long)*pauVar31 + 8);
            auVar57._12_4_ = auVar59._12_4_ * *(float *)((long)*pauVar31 + 0xc);
            auVar57._16_4_ = auVar59._16_4_ * *(float *)((long)*pauVar31 + 0x10);
            auVar57._20_4_ = auVar59._20_4_ * *(float *)((long)*pauVar31 + 0x14);
            auVar57._24_4_ = auVar59._24_4_ * *(float *)((long)*pauVar31 + 0x18);
            auVar57._28_4_ = auVar59._28_4_;
            auVar9 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar9),auVar57);
            *pauVar31 = ZEXT1632(auVar9);
            ppp_Var25 = ppp_Var25 + 4;
            pauVar31 = pauVar31 + 1;
            iVar33 = iVar33 + 8;
            uVar21 = uVar37;
            iStack_164 = local_168;
            iStack_160 = local_168;
            iStack_15c = local_168;
            iStack_158 = local_168;
            iStack_154 = local_168;
            iStack_150 = local_168;
            iStack_14c = local_168;
            fStack_d4 = local_d8;
            fStack_d0 = local_d8;
            fStack_cc = local_d8;
            fStack_c8 = local_d8;
            fStack_c4 = local_d8;
            fStack_c0 = local_d8;
            fStack_bc = local_d8;
          } while (iVar33 < (int)uVar41);
        }
        if (uVar41 - uVar21 != 0 && (int)uVar21 <= (int)uVar41) {
          lVar36 = 0;
          do {
            auVar9 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var25 + lVar36 * 4)),auVar65._0_16_
                                     ,ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var22[-3])));
            fVar70 = powf(auVar9._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var22[-3]));
            auVar65 = ZEXT1664(local_148);
            *(float *)((long)*pauVar31 + lVar36 * 4) =
                 fVar70 * *(float *)((long)*pauVar31 + lVar36 * 4);
            lVar36 = lVar36 + 1;
          } while (uVar41 - uVar21 != (int)lVar36);
        }
        uVar24 = local_b8._0_8_ + 1;
        auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        uVar27 = local_1c0;
        uVar37 = (uint)local_220;
      } while (uVar24 != local_1c0);
    }
    piVar17 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
    iVar33 = 0;
    if (piVar17 == (int *)0x0) goto LAB_0032a97b;
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 != 0) goto LAB_0032a97b;
    if (local_218.allocator != (Allocator *)0x0) {
      (*(local_218.allocator)->_vptr_Allocator[3])();
      goto LAB_0032a97b;
    }
  }
  else {
    if (*(int *)(&this->field_0xd0 + (long)pp_Var22[-3]) != 1) goto LAB_0032a97b;
    piVar17 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
    local_218.data = local_1b8.data;
    local_218.refcount._0_4_ = (int)local_1b8.refcount;
    local_218.refcount._4_4_ = local_1b8.refcount._4_4_;
    local_218.elemsize._0_4_ = (undefined4)local_1b8.elemsize;
    local_218.elemsize._4_4_ = (undefined4)(local_1b8.elemsize >> 0x20);
    local_218.elempack = local_1b8.elempack;
    local_218.allocator = local_1b8.allocator;
    local_218.dims = local_1b8.dims;
    local_218.w = local_1b8.w;
    local_218.h = local_1b8.h;
    local_218.d = local_1b8.d;
    local_218.c = local_1b8.c;
    local_218.cstep = local_1b8.cstep;
    if (piVar17 != (int *)0x0) {
      LOCK();
      *piVar17 = *piVar17 + 1;
      UNLOCK();
      pp_Var22 = this->_vptr_LRN_x86_avx512;
    }
    p_Var26 = pp_Var22[-3];
    fVar70 = *(float *)(&this->field_0xd4 + (long)p_Var26);
    iVar33 = local_168;
    if (1 < (int)fVar70) {
      uVar41 = (uint)fVar70 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar33 = ~uVar41 + *(int *)(&this->field_0xd4 + (long)pp_Var22[-3]);
      copy_make_border(&local_1b8,&local_218,uVar41,iVar33,uVar41,iVar33,0,0.0,(Option *)&_space_ofs
                      );
      if (((Allocator *)local_218.data == (Allocator *)0x0) ||
         ((long)local_218.c * local_218.cstep == 0)) {
        piVar17 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
        if (piVar17 != (int *)0x0) {
          LOCK();
          *piVar17 = *piVar17 + -1;
          UNLOCK();
          if (*piVar17 == 0) {
            if (local_218.allocator == (Allocator *)0x0) goto joined_r0x0032a953;
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
        goto LAB_0032a976;
      }
      p_Var26 = this->_vptr_LRN_x86_avx512[-3];
      fVar70 = *(float *)(&this->field_0xd4 + (long)p_Var26);
      iVar33 = local_218.w;
    }
    local_b8._0_8_ = CONCAT44(0,(int)fVar70 * (int)fVar70);
    local_148._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)p_Var26);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,local_b8._0_8_,&local_221);
    piVar20 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var22 = this->_vptr_LRN_x86_avx512;
    iVar38 = *(int *)(&this->field_0xd4 + (long)pp_Var22[-3]);
    if (0 < iVar38) {
      iVar33 = iVar33 - iVar38;
      iVar23 = 0;
      iVar28 = 0;
      iVar32 = 0;
      do {
        if (0 < iVar38) {
          lVar36 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar32 + lVar36] = iVar28 + (int)lVar36;
            iVar38 = *(int *)(&this->field_0xd4 + (long)pp_Var22[-3]);
            lVar36 = lVar36 + 1;
            iVar35 = (int)lVar36;
          } while (iVar35 < iVar38);
          iVar32 = iVar32 + iVar35;
          iVar28 = iVar28 + iVar35;
        }
        iVar28 = iVar28 + iVar33;
        iVar23 = iVar23 + 1;
      } while (iVar23 < iVar38);
    }
    local_d8 = fVar70;
    if (0 < (int)uVar37) {
      local_100 = (long)local_168;
      iVar33 = local_b8._0_4_;
      local_118 = bottom_top_blob->data;
      local_120 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_128 = (Allocator *)local_218.data;
      local_130 = local_218.cstep *
                  CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize);
      local_110 = (long)local_218.w *
                  CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize);
      auVar65 = vpbroadcastq_avx512f();
      local_1c8 = (Mat *)CONCAT44(local_1c8._4_4_,1.0 / (float)iVar33);
      local_1d0 = 0;
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_b8 = vmovdqu64_avx512f(auVar65);
      do {
        if (0 < (int)(uint)local_220) {
          local_108 = (_func_int ***)((long)&local_128->_vptr_Allocator + local_130 * local_1d0);
          pvVar39 = (void *)(local_120 * local_1d0 + (long)local_118);
          pp_Var22 = this->_vptr_LRN_x86_avx512;
          auVar49._24_8_ = 0;
          auVar49._0_24_ = local_f8._8_24_;
          local_f8 = auVar49 << 0x40;
          do {
            ppp_Var25 = local_108;
            if (0 < local_168) {
              lVar36 = local_110 * local_f8._0_8_;
              lVar40 = 0;
              do {
                if (local_d8 == 0.0) {
                  fVar70 = 0.0;
                }
                else {
                  uVar27 = 0;
                  auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar72 = auVar68;
                    auVar68 = vpbroadcastq_avx512f();
                    auVar69 = vporq_avx512f(auVar68,auVar66);
                    auVar68 = vporq_avx512f(auVar68,auVar67);
                    uVar10 = vpcmpuq_avx512f(auVar68,auVar65,2);
                    bVar15 = (byte)uVar10;
                    uVar10 = vpcmpuq_avx512f(auVar69,auVar65,2);
                    bVar16 = (byte)uVar10;
                    uVar42 = CONCAT11(bVar16,bVar15);
                    vmovdqu32_avx512f(*(undefined1 (*) [64])(piVar20 + uVar27));
                    auVar68 = vgatherdps_avx512f(*(undefined4 *)
                                                  ((long)ppp_Var25 +
                                                  uVar27 * 4 + lVar40 * 4 + lVar36));
                    auVar69._4_4_ = (uint)((byte)(uVar42 >> 1) & 1) * auVar68._4_4_;
                    auVar69._0_4_ = (uint)(bVar15 & 1) * auVar68._0_4_;
                    auVar69._8_4_ = (uint)((byte)(uVar42 >> 2) & 1) * auVar68._8_4_;
                    auVar69._12_4_ = (uint)((byte)(uVar42 >> 3) & 1) * auVar68._12_4_;
                    auVar69._16_4_ = (uint)((byte)(uVar42 >> 4) & 1) * auVar68._16_4_;
                    auVar69._20_4_ = (uint)((byte)(uVar42 >> 5) & 1) * auVar68._20_4_;
                    auVar69._24_4_ = (uint)((byte)(uVar42 >> 6) & 1) * auVar68._24_4_;
                    auVar69._28_4_ = (uint)((byte)(uVar42 >> 7) & 1) * auVar68._28_4_;
                    auVar69._32_4_ = (uint)(bVar16 & 1) * auVar68._32_4_;
                    auVar69._36_4_ = (uint)(bVar16 >> 1 & 1) * auVar68._36_4_;
                    auVar69._40_4_ = (uint)(bVar16 >> 2 & 1) * auVar68._40_4_;
                    auVar69._44_4_ = (uint)(bVar16 >> 3 & 1) * auVar68._44_4_;
                    auVar69._48_4_ = (uint)(bVar16 >> 4 & 1) * auVar68._48_4_;
                    auVar69._52_4_ = (uint)(bVar16 >> 5 & 1) * auVar68._52_4_;
                    auVar69._56_4_ = (uint)(bVar16 >> 6 & 1) * auVar68._56_4_;
                    auVar69._60_4_ = (uint)(bVar16 >> 7) * auVar68._60_4_;
                    auVar68 = vaddps_avx512f(auVar69,auVar72);
                    uVar27 = uVar27 + 0x10;
                  } while ((iVar33 + (uint)(iVar33 == 0) + 0xf & 0xfffffff0) != uVar27);
                  auVar65._0_4_ =
                       (uint)(bVar15 & 1) * auVar68._0_4_ |
                       (uint)!(bool)(bVar15 & 1) * auVar72._0_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 1) & 1);
                  auVar65._4_4_ = (uint)bVar8 * auVar68._4_4_ | (uint)!bVar8 * auVar72._4_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 2) & 1);
                  auVar65._8_4_ = (uint)bVar8 * auVar68._8_4_ | (uint)!bVar8 * auVar72._8_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 3) & 1);
                  auVar65._12_4_ = (uint)bVar8 * auVar68._12_4_ | (uint)!bVar8 * auVar72._12_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 4) & 1);
                  auVar65._16_4_ = (uint)bVar8 * auVar68._16_4_ | (uint)!bVar8 * auVar72._16_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 5) & 1);
                  auVar65._20_4_ = (uint)bVar8 * auVar68._20_4_ | (uint)!bVar8 * auVar72._20_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 6) & 1);
                  auVar65._24_4_ = (uint)bVar8 * auVar68._24_4_ | (uint)!bVar8 * auVar72._24_4_;
                  bVar8 = (bool)((byte)(uVar42 >> 7) & 1);
                  auVar65._28_4_ = (uint)bVar8 * auVar68._28_4_ | (uint)!bVar8 * auVar72._28_4_;
                  auVar65._32_4_ =
                       (uint)(bVar16 & 1) * auVar68._32_4_ |
                       (uint)!(bool)(bVar16 & 1) * auVar72._32_4_;
                  bVar8 = (bool)(bVar16 >> 1 & 1);
                  auVar65._36_4_ = (uint)bVar8 * auVar68._36_4_ | (uint)!bVar8 * auVar72._36_4_;
                  bVar8 = (bool)(bVar16 >> 2 & 1);
                  auVar65._40_4_ = (uint)bVar8 * auVar68._40_4_ | (uint)!bVar8 * auVar72._40_4_;
                  bVar8 = (bool)(bVar16 >> 3 & 1);
                  auVar65._44_4_ = (uint)bVar8 * auVar68._44_4_ | (uint)!bVar8 * auVar72._44_4_;
                  bVar8 = (bool)(bVar16 >> 4 & 1);
                  auVar65._48_4_ = (uint)bVar8 * auVar68._48_4_ | (uint)!bVar8 * auVar72._48_4_;
                  bVar8 = (bool)(bVar16 >> 5 & 1);
                  auVar65._52_4_ = (uint)bVar8 * auVar68._52_4_ | (uint)!bVar8 * auVar72._52_4_;
                  bVar8 = (bool)(bVar16 >> 6 & 1);
                  auVar65._56_4_ = (uint)bVar8 * auVar68._56_4_ | (uint)!bVar8 * auVar72._56_4_;
                  auVar65._60_4_ =
                       (uint)(bVar16 >> 7) * auVar68._60_4_ |
                       (uint)!(bool)(bVar16 >> 7) * auVar72._60_4_;
                  auVar64 = vextractf64x4_avx512f(auVar65,1);
                  auVar65 = vaddps_avx512f(auVar65,ZEXT3264(auVar64));
                  auVar43._0_4_ = auVar65._0_4_ + auVar65._16_4_;
                  auVar43._4_4_ = auVar65._4_4_ + auVar65._20_4_;
                  auVar43._8_4_ = auVar65._8_4_ + auVar65._24_4_;
                  auVar43._12_4_ = auVar65._12_4_ + auVar65._28_4_;
                  auVar9 = vshufpd_avx(auVar43,auVar43,1);
                  auVar71._0_4_ = auVar43._0_4_ + auVar9._0_4_;
                  auVar71._4_4_ = auVar43._4_4_ + auVar9._4_4_;
                  auVar71._8_4_ = auVar43._8_4_ + auVar9._8_4_;
                  auVar71._12_4_ = auVar43._12_4_ + auVar9._12_4_;
                  auVar9 = vhaddps_avx(auVar71,auVar71);
                  fVar70 = auVar9._0_4_;
                }
                auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar70 * (float)local_148._0_4_)),
                                         ZEXT416((uint)local_1c8),
                                         ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var22[-3])))
                ;
                auVar11._8_4_ = 0x80000000;
                auVar11._0_8_ = 0x8000000080000000;
                auVar11._12_4_ = 0x80000000;
                auVar43 = vxorps_avx512vl(ZEXT416(*(uint *)(&this->field_0xdc + (long)pp_Var22[-3]))
                                          ,auVar11);
                fVar70 = powf(auVar9._0_4_,auVar43._0_4_);
                *(float *)((long)pvVar39 + lVar40 * 4) =
                     fVar70 * *(float *)((long)pvVar39 + lVar40 * 4);
                lVar40 = lVar40 + 1;
                auVar65 = vmovdqu64_avx512f(local_b8);
                auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              } while (lVar40 != CONCAT44(iStack_164,local_168));
            }
            pvVar39 = (void *)((long)pvVar39 + local_100 * 4);
            uVar27 = local_f8._0_8_ + 1;
            local_f8._0_8_ = uVar27;
          } while (uVar27 != local_220);
        }
        local_1d0 = local_1d0 + 1;
      } while (local_1d0 != local_1c0);
    }
    if (piVar20 != (pointer)0x0) {
      operator_delete(piVar20,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage - (long)piVar20);
    }
    piVar17 = (int *)CONCAT44(local_218.refcount._4_4_,(int)local_218.refcount);
    iVar33 = 0;
    if (piVar17 == (int *)0x0) goto LAB_0032a97b;
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 != 0) goto LAB_0032a97b;
    if (local_218.allocator != (Allocator *)0x0) {
      (*(local_218.allocator)->_vptr_Allocator[3])();
      goto LAB_0032a97b;
    }
  }
  iVar33 = 0;
  if ((Allocator *)local_218.data != (Allocator *)0x0) {
    iVar33 = 0;
    free(local_218.data);
  }
LAB_0032a97b:
  piVar17 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1b8.data != (Allocator *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}